

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcpLight.c
# Opt level: O2

void XcpLight_init(void)

{
  XcpLight_self.timestamp_counter = 0;
  XcpLight_self.session_status = '\0';
  XcpLight_self.protection_status = 0xff;
  XcpLight_self.seed_index = '\0';
  XcpLight_self.remaining_seed_bytes = '\0';
  XcpLight_self.key_index = '\0';
  XcpLight_self.unlock_resource = '\0';
  return;
}

Assistant:

void XcpLight_init(void)
{
  XcpLight_self.timestamp_counter     = 0u;
  XcpLight_self.session_status        = XCP_SES_RESET_SESSION;

  XcpLight_self.seed_index            = 0u;
  XcpLight_self.remaining_seed_bytes  = 0u;
  XcpLight_self.key_index             = 0u;
  XcpLight_self.unlock_resource       = 0u;

#ifdef XCPLIGHT_CFG_SEED_AND_KEY
  XcpLight_self.protection_status     = XCP_PRT_PROTECT_ALL;
#endif
}